

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,Pair<unsigned_int,_int,_DefaultComparer> *key,PropertySym **value)

{
  BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  long lVar5;
  code *pcVar6;
  long lVar7;
  bool bVar8;
  hash_t hVar9;
  int iVar10;
  undefined4 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong extraout_RDX;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint key_00;
  undefined1 auVar18 [16];
  ulong uVar14;
  
  lVar17 = *(long *)this;
  if (lVar17 == 0) {
    BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar17 = *(long *)this;
  }
  key_00 = key->second + key->first & 0x7fffffff;
  hVar9 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar12 = *(uint *)(lVar17 + (ulong)hVar9 * 4);
  if ((int)uVar12 < 0) {
    uVar15 = 0;
  }
  else {
    uVar2 = key->first;
    uVar4 = key->second;
    uVar15 = 0;
    uVar14 = extraout_RDX;
    do {
      uVar3 = *(undefined8 *)(*(long *)(this + 8) + 0xc + (ulong)uVar12 * 0x18);
      auVar18._0_4_ = -(uint)((int)uVar3 == uVar2);
      auVar18._4_4_ = -(uint)((int)((ulong)uVar3 >> 0x20) == uVar4);
      auVar18._8_4_ = 0xffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = pmovsxdq(auVar18,auVar18);
      uVar13 = movmskpd((int)uVar14,auVar18);
      uVar14 = (ulong)uVar13;
      if (uVar13 == 3) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar15);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar8) {
          *puVar11 = 0;
          return -1;
        }
        goto LAB_0062f3a0;
      }
      uVar15 = uVar15 + 1;
      uVar12 = *(uint *)(*(long *)(this + 8) + (ulong)uVar12 * 0x18 + 8);
    } while (-1 < (int)uVar12);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar15);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar10 = *(int *)(this + 0x18);
    iVar16 = *(int *)(this + 0x20);
    if (iVar16 == iVar10) {
      BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      hVar9 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar10 = *(int *)(this + 0x18);
      iVar16 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar16 + 1;
    if (iVar10 < iVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar8) goto LAB_0062f3a0;
      *puVar11 = 0;
      iVar10 = *(int *)(this + 0x18);
    }
    if (iVar10 <= iVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar8) goto LAB_0062f3a0;
      *puVar11 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar8) goto LAB_0062f3a0;
      *puVar11 = 0;
    }
    iVar16 = *(int *)(this + 0x24);
    if (iVar16 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar8) goto LAB_0062f3a0;
      *puVar11 = 0;
      iVar16 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar8) {
LAB_0062f3a0:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar11 = 0;
      iVar16 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar10 = BaseDictionary<JsUtil::Pair<unsigned_int,_int,_DefaultComparer>,_PropertySym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex((EntryType *)((long)iVar16 * 0x18 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar10;
    }
  }
  lVar17 = *(long *)(this + 8);
  lVar7 = (long)iVar16 * 0x18;
  *(PropertySym **)(lVar17 + lVar7) = *value;
  *(undefined8 *)(lVar17 + 0xc + lVar7) = *(undefined8 *)key;
  *(bool *)(lVar17 + 0x14 + lVar7) = key->initialized;
  lVar17 = *(long *)this;
  lVar5 = *(long *)(this + 8);
  *(undefined4 *)(lVar5 + 8 + lVar7) = *(undefined4 *)(lVar17 + (ulong)hVar9 * 4);
  *(int *)(lVar17 + (ulong)hVar9 * 4) = iVar16;
  uVar15 = 0;
  iVar10 = iVar16;
  do {
    iVar10 = *(int *)(lVar5 + 8 + (long)iVar10 * 0x18);
    uVar15 = uVar15 + 1;
  } while (iVar10 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar15);
  }
  return iVar16;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }